

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_promise_then_finally_func
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int magic,
                  JSValue *func_data)

{
  JSValue JVar1;
  int iVar2;
  code *func;
  JSRuntime *rt;
  JSRefCountHeader *p_1;
  JSValue JVar3;
  JSValueUnion local_58;
  undefined8 uStack_50;
  JSValue *local_48;
  JSValueUnion local_40 [2];
  
  JVar1 = *func_data;
  local_58.ptr = (void *)(local_58 << 0x20);
  uStack_50 = 3;
  iVar2 = 0;
  JVar3.tag = 3;
  JVar3.u.ptr = local_58.ptr;
  local_48 = argv;
  JVar3 = JS_CallInternal(ctx,func_data[1],(JSValue)(ZEXT816(3) << 0x40),JVar3,0,(JSValue *)0x0,2);
  if ((int)JVar3.tag != 6) {
    _local_58 = JVar3;
    JVar3 = js_promise_resolve(ctx,JVar1,iVar2,(JSValue *)&local_58,0);
    if (0xfffffff4 < local_58._8_4_) {
      iVar2 = *local_58.ptr;
      *(int *)local_58.ptr = iVar2 + -1;
      if (iVar2 < 2) {
        __JS_FreeValueRT(ctx->rt,_local_58);
      }
    }
    if ((uint)JVar3.tag != 6) {
      func = js_promise_finally_thrower;
      if (magic == 0) {
        func = js_promise_finally_value_thunk;
      }
      local_40 = (JSValueUnion  [2])JS_NewCFunctionData(ctx,func,0,0,1,local_48);
      if (local_40[1]._0_4_ == 6) {
        if ((uint)JVar3.tag < 0xfffffff5) {
          return (JSValue)local_40;
        }
        iVar2 = *JVar3.u.ptr;
        *(int *)JVar3.u.ptr = iVar2 + -1;
        if (1 < iVar2) {
          return (JSValue)local_40;
        }
        rt = ctx->rt;
        JVar1 = JVar3;
        JVar3 = (JSValue)local_40;
      }
      else {
        JVar3 = JS_InvokeFree(ctx,JVar3,0x7f,1,(JSValue *)local_40);
        if (local_40[1]._0_4_ < 0xfffffff5) {
          return JVar3;
        }
        iVar2 = *local_40[0].ptr;
        *(int *)local_40[0].ptr = iVar2 + -1;
        if (1 < iVar2) {
          return JVar3;
        }
        rt = ctx->rt;
        JVar1 = (JSValue)local_40;
      }
      __JS_FreeValueRT(rt,JVar1);
    }
  }
  return JVar3;
}

Assistant:

static JSValue js_promise_then_finally_func(JSContext *ctx, JSValueConst this_val,
                                            int argc, JSValueConst *argv,
                                            int magic, JSValue *func_data)
{
    JSValueConst ctor = func_data[0];
    JSValueConst onFinally = func_data[1];
    JSValue res, promise, ret, then_func;

    res = JS_Call(ctx, onFinally, JS_UNDEFINED, 0, NULL);
    if (JS_IsException(res))
        return res;
    promise = js_promise_resolve(ctx, ctor, 1, (JSValueConst *)&res, 0);
    JS_FreeValue(ctx, res);
    if (JS_IsException(promise))
        return promise;
    if (magic == 0) {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_value_thunk, 0,
                                        0, 1, argv);
    } else {
        then_func = JS_NewCFunctionData(ctx, js_promise_finally_thrower, 0,
                                        0, 1, argv);
    }
    if (JS_IsException(then_func)) {
        JS_FreeValue(ctx, promise);
        return then_func;
    }
    ret = JS_InvokeFree(ctx, promise, JS_ATOM_then, 1, (JSValueConst *)&then_func);
    JS_FreeValue(ctx, then_func);
    return ret;
}